

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H22_radix_sort.c
# Opt level: O3

void sort(uint *A,uint *B,int n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int C [64];
  int local_138 [66];
  
  uVar5 = (ulong)(uint)n;
  uVar7 = 0;
  do {
    memset(local_138,0,0x100);
    iVar2 = 0;
    if (0 < n) {
      uVar3 = 0;
      do {
        local_138[A[uVar3] >> ((byte)uVar7 & 0x1f) & 0x3f] =
             local_138[A[uVar3] >> ((byte)uVar7 & 0x1f) & 0x3f] + 1;
        uVar3 = uVar3 + 1;
        iVar2 = local_138[0];
      } while (uVar5 != uVar3);
    }
    lVar4 = 1;
    do {
      iVar2 = iVar2 + local_138[lVar4];
      local_138[lVar4] = iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    lVar4 = uVar5 + 1;
    if (0 < n) {
      do {
        uVar1 = A[lVar4 + -2];
        uVar6 = uVar1 >> ((byte)uVar7 & 0x1f) & 0x3f;
        iVar2 = local_138[uVar6];
        local_138[uVar6] = iVar2 + -1;
        B[(long)iVar2 + -1] = uVar1;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
      if (0 < n) {
        uVar3 = 0;
        do {
          A[uVar3] = B[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
    }
    bVar8 = uVar7 < 0x1a;
    uVar7 = uVar7 + 6;
  } while (bVar8);
  return;
}

Assistant:

void sort(unsigned int A[], unsigned int B[], int n) {
  int i, bit;
  int C[M];

  for (bit = 0; bit < 32; bit += 6) {
    for (i = 0; i < M; ++i) {
      C[i] = 0;
    }
    for (i = 0; i < n; ++i) {
      ++C[(A[i] >> bit) & MASK];
    }

    for (i = 1; i < M; ++i) {
      C[i] += C[i - 1];
    }

    for (i = n - 1; i >= 0; --i) {
      B[--C[(A[i] >> bit) & MASK]] = A[i];
    }

    for (i = 0; i < n; i++) {
      A[i] = B[i];
    }
  }
}